

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O0

void __thiscall UnitTest_semantic21::Run(UnitTest_semantic21 *this)

{
  bool bVar1;
  SemanticException *anon_var_0;
  allocator *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff38;
  UnitTestBase *in_stack_ffffffffffffff40;
  allocator local_99;
  string local_98 [47];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"function f(...) return ... end",&local_31);
  anon_unknown.dwarf_fc1b::Semantic(in_stack_ffffffffffffff38);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x1ac75d);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_ffffffffffffff10);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffff10 = &local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_68,"\'Semantic(\"function f(...) return ... end\")\'",in_stack_ffffffffffffff10
              );
    UnitTestBase::Error(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_98,"function f(...) return function() return ... end end",&local_99);
  anon_unknown.dwarf_fc1b::Semantic(in_stack_ffffffffffffff38);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_ffffffffffffff10);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff40,
             "\'{ Semantic(\"function f(...) return function() return ... end end\"); }\' has no luna::SemanticException"
             ,(allocator *)&stack0xffffffffffffff3f);
  UnitTestBase::Error(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff3f);
  return;
}

Assistant:

TEST_CASE(semantic21)
{
    EXPECT_TRUE(Semantic("function f(...) return ... end"));
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("function f(...) return function() return ... end end");
    });
}